

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall CLI::App::get_option(App *this,string *option_name)

{
  pointer pcVar1;
  pointer puVar2;
  pointer psVar3;
  App *this_00;
  bool bVar4;
  Option *pOVar5;
  OptionNotFound *this_01;
  shared_ptr<CLI::App> *subc;
  pointer psVar6;
  pointer puVar7;
  Option *unaff_R14;
  bool bVar8;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (option_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + option_name->_M_string_length);
  puVar7 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = puVar7 == puVar2;
  if (!bVar8) {
    do {
      bVar4 = Option::check_name((puVar7->_M_t).
                                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                                 .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_90
                                );
      if (bVar4) {
        unaff_R14 = (puVar7->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        break;
      }
      puVar7 = puVar7 + 1;
      bVar8 = puVar7 == puVar2;
    } while (!bVar8);
  }
  if (bVar8) {
    psVar6 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar6 != psVar3) {
      do {
        this_00 = (psVar6->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        bVar8 = true;
        if ((this_00->name_)._M_string_length == 0) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_90._M_dataplus._M_p,
                     local_90._M_dataplus._M_p + local_90._M_string_length);
          pOVar5 = get_option_no_throw(this_00,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          bVar8 = pOVar5 == (Option *)0x0;
          if (!bVar8) {
            unaff_R14 = pOVar5;
          }
        }
        if (!bVar8) goto LAB_00126807;
        psVar6 = psVar6 + 1;
      } while (psVar6 != psVar3);
    }
    unaff_R14 = (Option *)0x0;
  }
LAB_00126807:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (unaff_R14 != (Option *)0x0) {
    return unaff_R14;
  }
  this_01 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (option_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + option_name->_M_string_length);
  OptionNotFound::OptionNotFound(this_01,&local_70);
  __cxa_throw(this_01,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

CLI11_NODISCARD const Option *get_option(std::string option_name) const {
        const auto *opt = get_option_no_throw(option_name);
        if(opt == nullptr) {
            throw OptionNotFound(option_name);
        }
        return opt;
    }